

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O3

int shallow_dump(nvamemtiming_conf *conf)

{
  byte bVar1;
  byte bVar2;
  FILE *pFVar3;
  ulong uVar4;
  char filename [21];
  char local_28 [32];
  
  bVar1 = (conf->field_4).manual.index;
  bVar2 = (conf->field_4).manual.value;
  uVar4 = (ulong)bVar2;
  if ((bVar1 == 0xff) || (uVar4 = 0xff, bVar2 == 0xff)) {
    sprintf(local_28,"regs_timing_%i_%i",(ulong)bVar1,uVar4);
  }
  else {
    builtin_strncpy(local_28,"regs_timing",0xc);
  }
  pFVar3 = fopen(local_28,"wb");
  if (pFVar3 != (FILE *)0x0) {
    shallow_dump_cold_1();
  }
  else {
    perror("Open regs_timing");
  }
  return (uint)(pFVar3 == (FILE *)0x0);
}

Assistant:

int
shallow_dump(struct nvamemtiming_conf *conf)
{
	char filename[21];
	int i;

	if (conf->range.start == (unsigned char) -1 ||  conf->range.end == (unsigned char) -1)
		sprintf(filename, "regs_timing_%i_%i", conf->range.start, conf->range.end);
	else
		sprintf(filename, "regs_timing");

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(filename, "wb");
	if (!outf) {
		perror("Open regs_timing");
		return 1;
	}

	if (nva_cards[conf->cnum]->chipset.card_type >= 0xc0)
		timing_value_types = nvc0_timing_value_types;
	else
		timing_value_types = nv40_timing_value_types;

	if (conf->range.start == (unsigned char) -1)
		conf->range.start = 0;
	if (conf->range.end == (unsigned char) -1)
		conf->range.end = conf->vbios.timing_entry_length - 1;

	fprintf(stderr, "Shallow mode: Will iterate between %i and %i\n", conf->range.start, conf->range.end);

	launch(conf, outf, 0, NO_COLOR);

	/* iterate through the vbios timing values */
	for (i = conf->range.start; i <= conf->range.end; i++) {
		uint8_t orig = conf->vbios.data[conf->vbios.timing_entry_offset + i];

		if (timing_value_types[i] == VALUE ||
			(timing_value_types[i] == EMPTY && orig > 0))
		{
			if (timing_value_types[i] == EMPTY && orig > 0)
				fprintf(outf, "WARNING: The following entry was supposed to be unused!\n");

			conf->vbios.data[conf->vbios.timing_entry_offset + i]++;
			launch(conf, outf, i + 1, COLOR);
		} else if (timing_value_types[i] == BITFIELD) {
			iterate_bitfield(conf, outf, i, COLOR);
		} else if (timing_value_types[i] == EMPTY) {
			fprintf(outf, "timing entry [%u/%u] is supposed empty\n\n",
				i + 1, conf->vbios.timing_entry_length);
		}

		conf->vbios.data[conf->vbios.timing_entry_offset + i] = orig;
	}

	fclose(outf);

	return 0;
}